

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fs_read_file_eof(int add_flags)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_buf_t uVar4;
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  uVar4.len = iov.len;
  uVar4.base = iov.base;
  if (iVar1 < 0) {
    pcVar3 = "r >= 0";
    uVar2 = 0xb8d;
  }
  else if (open_req1.result._4_4_ < 0) {
    pcVar3 = "open_req1.result >= 0";
    uVar2 = 0xb8e;
    iov = uVar4;
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar1 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,&iov,1,0xffffffffffffffff,0);
    if (iVar1 < 0) {
      pcVar3 = "r >= 0";
      uVar2 = 0xb93;
    }
    else if (write_req.result < 0) {
      pcVar3 = "write_req.result >= 0";
      uVar2 = 0xb94;
    }
    else {
      uv_fs_req_cleanup(&write_req);
      iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
      if (iVar1 == 0) {
        if (close_req.result == 0) {
          uv_fs_req_cleanup(&close_req);
          iVar1 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
          if (iVar1 < 0) {
            pcVar3 = "r >= 0";
            uVar2 = 0xb9e;
          }
          else if (open_req1.result._4_4_ < 0) {
            pcVar3 = "open_req1.result >= 0";
            uVar2 = 0xb9f;
          }
          else {
            uv_fs_req_cleanup(&open_req1);
            buf[0x10] = '\0';
            buf[0x11] = '\0';
            buf[0x12] = '\0';
            buf[0x13] = '\0';
            buf[0x14] = '\0';
            buf[0x15] = '\0';
            buf[0x16] = '\0';
            buf[0x17] = '\0';
            buf[0x18] = '\0';
            buf[0x19] = '\0';
            buf[0x1a] = '\0';
            buf[0x1b] = '\0';
            buf[0x1c] = '\0';
            buf[0x1d] = '\0';
            buf[0x1e] = '\0';
            buf[0x1f] = '\0';
            buf[0] = '\0';
            buf[1] = '\0';
            buf[2] = '\0';
            buf[3] = '\0';
            buf[4] = '\0';
            buf[5] = '\0';
            buf[6] = '\0';
            buf[7] = '\0';
            buf[8] = '\0';
            buf[9] = '\0';
            buf[10] = '\0';
            buf[0xb] = '\0';
            buf[0xc] = '\0';
            buf[0xd] = '\0';
            buf[0xe] = '\0';
            buf[0xf] = '\0';
            uVar4 = (uv_buf_t)uv_buf_init(buf,0x20);
            iov = uVar4;
            iVar1 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,0xffffffffffffffff,0)
            ;
            if (iVar1 < 0) {
              pcVar3 = "r >= 0";
              uVar2 = 0xba5;
            }
            else if (read_req.result < 0) {
              pcVar3 = "read_req.result >= 0";
              uVar2 = 0xba6;
            }
            else {
              iVar1 = strcmp(buf,test_buf);
              if (iVar1 == 0) {
                uv_fs_req_cleanup(&read_req);
                uVar4 = (uv_buf_t)uv_buf_init(buf,0x20);
                iov = uVar4;
                iVar1 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,read_req.result,0
                                  );
                if (iVar1 == 0) {
                  if (read_req.result == 0) {
                    uv_fs_req_cleanup(&read_req);
                    iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
                    if (iVar1 == 0) {
                      if (close_req.result == 0) {
                        uv_fs_req_cleanup(&close_req);
                        unlink("test_file");
                        return;
                      }
                      pcVar3 = "close_req.result == 0";
                      uVar2 = 0xbb3;
                    }
                    else {
                      pcVar3 = "r == 0";
                      uVar2 = 0xbb2;
                    }
                  }
                  else {
                    pcVar3 = "read_req.result == 0";
                    uVar2 = 0xbae;
                  }
                }
                else {
                  pcVar3 = "r == 0";
                  uVar2 = 0xbad;
                }
              }
              else {
                pcVar3 = "strcmp(buf, test_buf) == 0";
                uVar2 = 0xba7;
              }
            }
          }
        }
        else {
          pcVar3 = "close_req.result == 0";
          uVar2 = 0xb99;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0xb98;
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void fs_read_file_eof(int add_flags) {
#if defined(__CYGWIN__) || defined(__MSYS__)
  RETURN_SKIP("Cygwin pread at EOF may (incorrectly) return data!");
#endif
  int r;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_WRONLY | O_CREAT | add_flags, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
      NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(read_req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1,
                 read_req.result, NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
}